

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::thread_resource_error>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::thread_resource_error>_>
           *this,runtime_error *x)

{
  error_info_container *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *pcVar5;
  
  *(undefined ***)&this->field_0x68 = &PTR___cxa_pure_virtual_001cd0a0;
  std::runtime_error::runtime_error((runtime_error *)this,x);
  *(undefined ***)
   &(this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
    super_thread_exception.super_system_error = &PTR__system_error_001cb398;
  uVar2 = *(undefined4 *)(x + 0x14);
  uVar3 = *(undefined4 *)(x + 0x18);
  uVar4 = *(undefined4 *)(x + 0x1c);
  (this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
  super_thread_exception.super_system_error.m_error_code.m_val = *(int *)(x + 0x10);
  *(undefined4 *)
   &(this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
    super_thread_exception.super_system_error.m_error_code.field_0x4 = uVar2;
  *(undefined4 *)
   &(this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
    super_thread_exception.super_system_error.m_error_code.m_cat = uVar3;
  *(undefined4 *)
   ((long)&(this->super_error_info_injector<boost::thread_resource_error>).
           super_thread_resource_error.super_thread_exception.super_system_error.m_error_code.m_cat
   + 4) = uVar4;
  (this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
  super_thread_exception.super_system_error.m_what._M_dataplus._M_p =
       (pointer)&(this->super_error_info_injector<boost::thread_resource_error>).
                 super_thread_resource_error.super_thread_exception.super_system_error.m_what.
                 field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->super_error_info_injector<boost::thread_resource_error>).
              super_thread_resource_error.super_thread_exception.super_system_error.m_what,
             *(long *)(x + 0x20),*(long *)(x + 0x28) + *(long *)(x + 0x20));
  *(undefined ***)
   &(this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
    super_thread_exception.super_system_error = &PTR__system_error_001ce3e8;
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_001cd140;
  peVar1 = *(error_info_container **)(x + 0x48);
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception.data_.px_ = peVar1
  ;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))();
  }
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception.throw_line_ =
       *(int *)(x + 0x60);
  pcVar5 = *(char **)(x + 0x58);
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception.throw_function_ =
       *(char **)(x + 0x50);
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception.throw_file_ =
       pcVar5;
  *(undefined8 *)
   &(this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
    super_thread_exception.super_system_error = 0x1ce300;
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception._vptr_exception =
       (_func_int **)0x1ce338;
  *(undefined8 *)&this->field_0x68 = 0x1ce370;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::thread_resource_error>).super_exception,
             (exception *)(x + 0x40));
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }